

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O3

Glyph * __thiscall
sf::Font::loadGlyph(Glyph *__return_storage_ptr__,Font *this,Uint32 codePoint,uint characterSize,
                   bool bold,float outlineThickness)

{
  uint width;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  pointer puVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  pointer puVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  long lVar9;
  int iVar10;
  size_type sVar11;
  uint uVar12;
  long lVar13;
  Font *this_01;
  float fVar14;
  IntRect IVar15;
  FT_Glyph glyphDesc;
  long local_90;
  uint local_84;
  ulong local_80;
  float local_78;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  mapped_type *local_40;
  long local_38;
  
  *(undefined8 *)&(__return_storage_ptr__->bounds).height = 0;
  (__return_storage_ptr__->textureRect).top = 0;
  (__return_storage_ptr__->textureRect).width = 0;
  __return_storage_ptr__->advance = 0.0;
  (__return_storage_ptr__->bounds).left = 0.0;
  (__return_storage_ptr__->bounds).top = 0.0;
  (__return_storage_ptr__->bounds).width = 0.0;
  (__return_storage_ptr__->textureRect).height = 0;
  pvVar3 = this->m_face;
  if ((((pvVar3 != (void *)0x0) &&
       (local_84 = characterSize, local_78 = outlineThickness,
       bVar6 = setCurrentSize(this,characterSize), bVar6)) &&
      (iVar7 = FT_Load_Char(pvVar3,codePoint,(-(local_78 != 0.0) & 1U) * '\b' + ' '), iVar7 == 0))
     && (iVar7 = FT_Get_Glyph(*(undefined8 *)((long)pvVar3 + 0x98),&local_90), iVar7 == 0)) {
    if (*(int *)(local_90 + 0x10) == 0x6f75746c) {
      if (bold) {
        FT_Outline_Embolden(local_90 + 0x28,0x40);
      }
      if ((local_78 != 0.0) || (NAN(local_78))) {
        pvVar4 = this->m_stroker;
        FT_Stroker_Set(pvVar4,(long)(local_78 * 64.0),1,0,0);
        FT_Glyph_Stroke(&local_90,pvVar4,1);
      }
      FT_Glyph_To_Bitmap(&local_90,0,0,1);
      lVar9 = local_90;
    }
    else {
      FT_Glyph_To_Bitmap(&local_90,0,0,1);
      lVar9 = local_90;
      if (bold) {
        FT_Bitmap_Embolden(this->m_library,local_90 + 0x30,0x40,0x40);
      }
      if ((local_78 != 0.0) || (NAN(local_78))) {
        poVar8 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"Failed to outline glyph (no fallback available)",0x2f);
        std::endl<char,std::char_traits<char>>(poVar8);
      }
    }
    fVar14 = (float)*(long *)(*(long *)((long)pvVar3 + 0x98) + 0x50) * 0.015625;
    if (bold) {
      fVar14 = fVar14 + 1.0;
    }
    __return_storage_ptr__->advance = fVar14;
    uVar12 = *(uint *)(lVar9 + 0x30);
    uVar2 = *(uint *)(lVar9 + 0x34);
    if (0 < (int)uVar12 && 0 < (int)uVar2) {
      width = uVar2 + 2;
      this_01 = (Font *)&this->m_pages;
      local_80 = (ulong)uVar12;
      local_38 = lVar9;
      local_40 = std::
                 map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
                 ::operator[]((map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
                               *)this_01,&local_84);
      IVar15 = findGlyphRect(this_01,local_40,width,uVar12 + 2);
      local_50 = IVar15._8_8_;
      local_48 = IVar15._0_8_;
      (__return_storage_ptr__->textureRect).left = IVar15.left + 1;
      local_58 = local_48 >> 0x20;
      (__return_storage_ptr__->textureRect).top = IVar15.top + 1;
      (__return_storage_ptr__->textureRect).width = IVar15.width + -2;
      local_60 = local_50 >> 0x20;
      (__return_storage_ptr__->textureRect).height = IVar15.height + -2;
      lVar9 = *(long *)((long)pvVar3 + 0x98);
      lVar13 = *(long *)(lVar9 + 0x48);
      (__return_storage_ptr__->bounds).left = (float)*(long *)(lVar9 + 0x40) * 0.015625;
      (__return_storage_ptr__->bounds).top = (float)lVar13 * -0.015625;
      lVar13 = *(long *)(lVar9 + 0x38);
      (__return_storage_ptr__->bounds).width =
           local_78 + local_78 + (float)*(long *)(lVar9 + 0x30) * 0.015625;
      (__return_storage_ptr__->bounds).height = local_78 + local_78 + (float)lVar13 * 0.015625;
      this_00 = &this->m_pixelBuffer;
      iVar7 = (uVar12 + 2) * width * 4;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,(long)iVar7);
      if (iVar7 != 0) {
        puVar5 = (this->m_pixelBuffer).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar11 = 0;
        do {
          puVar1 = puVar5 + sVar11;
          puVar1[0] = 0xff;
          puVar1[1] = 0xff;
          puVar1[2] = 0xff;
          puVar1[3] = '\0';
          sVar11 = sVar11 + 4;
        } while ((long)iVar7 != sVar11);
      }
      lVar9 = *(long *)(local_38 + 0x40);
      if (*(char *)(local_38 + 0x4a) == '\x01') {
        iVar10 = uVar2 + 3;
        iVar7 = 1;
        do {
          uVar12 = 0;
          do {
            (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start[(ulong)(iVar10 + uVar12) * 4 + 3] =
                 -((*(byte *)(lVar9 + (ulong)(uVar12 >> 3)) >> (~(byte)uVar12 & 7) & 1) != 0);
            uVar12 = uVar12 + 1;
          } while (uVar2 != uVar12);
          lVar9 = lVar9 + *(int *)(local_38 + 0x38);
          iVar10 = iVar10 + width;
          bVar6 = iVar7 != (int)local_80;
          iVar7 = iVar7 + 1;
        } while (bVar6);
      }
      else {
        iVar10 = uVar2 + 3;
        iVar7 = 1;
        do {
          lVar13 = 0;
          do {
            (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start[(ulong)(uint)(iVar10 + (int)lVar13) * 4 + 3] =
                 *(uchar *)(lVar9 + lVar13);
            lVar13 = lVar13 + 1;
          } while (uVar2 != (uint)lVar13);
          lVar9 = lVar9 + *(int *)(local_38 + 0x38);
          iVar10 = iVar10 + width;
          bVar6 = iVar7 != (int)local_80;
          iVar7 = iVar7 + 1;
        } while (bVar6);
      }
      Texture::update(&local_40->texture,
                      (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start,(uint)local_50,(uint)local_60,
                      (uint)local_48,(uint)local_58);
    }
    FT_Done_Glyph(local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

Glyph Font::loadGlyph(Uint32 codePoint, unsigned int characterSize, bool bold, float outlineThickness) const
{
    // The glyph to return
    Glyph glyph;

    // First, transform our ugly void* to a FT_Face
    FT_Face face = static_cast<FT_Face>(m_face);
    if (!face)
        return glyph;

    // Set the character size
    if (!setCurrentSize(characterSize))
        return glyph;

    // Load the glyph corresponding to the code point
    FT_Int32 flags = FT_LOAD_TARGET_NORMAL | FT_LOAD_FORCE_AUTOHINT;
    if (outlineThickness != 0)
        flags |= FT_LOAD_NO_BITMAP;
    if (FT_Load_Char(face, codePoint, flags) != 0)
        return glyph;

    // Retrieve the glyph
    FT_Glyph glyphDesc;
    if (FT_Get_Glyph(face->glyph, &glyphDesc) != 0)
        return glyph;

    // Apply bold and outline (there is no fallback for outline) if necessary -- first technique using outline (highest quality)
    FT_Pos weight = 1 << 6;
    bool outline = (glyphDesc->format == FT_GLYPH_FORMAT_OUTLINE);
    if (outline)
    {
        if (bold)
        {
            FT_OutlineGlyph outlineGlyph = (FT_OutlineGlyph)glyphDesc;
            FT_Outline_Embolden(&outlineGlyph->outline, weight);
        }

        if (outlineThickness != 0)
        {
            FT_Stroker stroker = static_cast<FT_Stroker>(m_stroker);

            FT_Stroker_Set(stroker, static_cast<FT_Fixed>(outlineThickness * static_cast<float>(1 << 6)), FT_STROKER_LINECAP_ROUND, FT_STROKER_LINEJOIN_ROUND, 0);
            FT_Glyph_Stroke(&glyphDesc, stroker, true);
        }
    }

    // Convert the glyph to a bitmap (i.e. rasterize it)
    FT_Glyph_To_Bitmap(&glyphDesc, FT_RENDER_MODE_NORMAL, 0, 1);
    FT_Bitmap& bitmap = reinterpret_cast<FT_BitmapGlyph>(glyphDesc)->bitmap;

    // Apply bold if necessary -- fallback technique using bitmap (lower quality)
    if (!outline)
    {
        if (bold)
            FT_Bitmap_Embolden(static_cast<FT_Library>(m_library), &bitmap, weight, weight);

        if (outlineThickness != 0)
            err() << "Failed to outline glyph (no fallback available)" << std::endl;
    }

    // Compute the glyph's advance offset
    glyph.advance = static_cast<float>(face->glyph->metrics.horiAdvance) / static_cast<float>(1 << 6);
    if (bold)
        glyph.advance += static_cast<float>(weight) / static_cast<float>(1 << 6);

    int width  = bitmap.width;
    int height = bitmap.rows;

    if ((width > 0) && (height > 0))
    {
        // Leave a small padding around characters, so that filtering doesn't
        // pollute them with pixels from neighbors
        const unsigned int padding = 1;

        width += 2 * padding;
        height += 2 * padding;

        // Get the glyphs page corresponding to the character size
        Page& page = m_pages[characterSize];

        // Find a good position for the new glyph into the texture
        glyph.textureRect = findGlyphRect(page, width, height);

        // Make sure the texture data is positioned in the center
        // of the allocated texture rectangle
        glyph.textureRect.left += padding;
        glyph.textureRect.top += padding;
        glyph.textureRect.width -= 2 * padding;
        glyph.textureRect.height -= 2 * padding;

        // Compute the glyph's bounding box
        glyph.bounds.left   =  static_cast<float>(face->glyph->metrics.horiBearingX) / static_cast<float>(1 << 6);
        glyph.bounds.top    = -static_cast<float>(face->glyph->metrics.horiBearingY) / static_cast<float>(1 << 6);
        glyph.bounds.width  =  static_cast<float>(face->glyph->metrics.width)        / static_cast<float>(1 << 6) + outlineThickness * 2;
        glyph.bounds.height =  static_cast<float>(face->glyph->metrics.height)       / static_cast<float>(1 << 6) + outlineThickness * 2;

        // Resize the pixel buffer to the new size and fill it with transparent white pixels
        m_pixelBuffer.resize(width * height * 4);

        Uint8* current = &m_pixelBuffer[0];
        Uint8* end = current + width * height * 4;

        while (current != end)
        {
            (*current++) = 255;
            (*current++) = 255;
            (*current++) = 255;
            (*current++) = 0;
        }

        // Extract the glyph's pixels from the bitmap
        const Uint8* pixels = bitmap.buffer;
        if (bitmap.pixel_mode == FT_PIXEL_MODE_MONO)
        {
            // Pixels are 1 bit monochrome values
            for (unsigned int y = padding; y < height - padding; ++y)
            {
                for (unsigned int x = padding; x < width - padding; ++x)
                {
                    // The color channels remain white, just fill the alpha channel
                    std::size_t index = x + y * width;
                    m_pixelBuffer[index * 4 + 3] = ((pixels[(x - padding) / 8]) & (1 << (7 - ((x - padding) % 8)))) ? 255 : 0;
                }
                pixels += bitmap.pitch;
            }
        }
        else
        {
            // Pixels are 8 bits gray levels
            for (unsigned int y = padding; y < height - padding; ++y)
            {
                for (unsigned int x = padding; x < width - padding; ++x)
                {
                    // The color channels remain white, just fill the alpha channel
                    std::size_t index = x + y * width;
                    m_pixelBuffer[index * 4 + 3] = pixels[x - padding];
                }
                pixels += bitmap.pitch;
            }
        }

        // Write the pixels to the texture
        unsigned int x = glyph.textureRect.left - padding;
        unsigned int y = glyph.textureRect.top - padding;
        unsigned int w = glyph.textureRect.width + 2 * padding;
        unsigned int h = glyph.textureRect.height + 2 * padding;
        page.texture.update(&m_pixelBuffer[0], w, h, x, y);
    }

    // Delete the FT glyph
    FT_Done_Glyph(glyphDesc);

    // Done :)
    return glyph;
}